

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall TestValueTestcompareArray::runTestCase(TestValueTestcompareArray *this)

{
  TestResult *pTVar1;
  Value l2bArray;
  Value l2aArray;
  Value l1aArray;
  Value emptyArray;
  Value l1bArray;
  ValueHolder local_138;
  char *local_130;
  undefined4 local_128;
  char *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  Value local_108;
  Value local_e0;
  Value local_b8;
  Value local_90;
  Value local_68;
  Value local_40;
  
  Json::Value::Value(&local_68,arrayValue);
  Json::Value::Value(&local_90,nullValue);
  Json::Value::Value((Value *)&local_138,0);
  Json::Value::append(&local_90,(Value *)&local_138);
  Json::Value::~Value((Value *)&local_138);
  Json::Value::Value(&local_40,nullValue);
  Json::Value::Value((Value *)&local_138,10);
  Json::Value::append(&local_40,(Value *)&local_138);
  Json::Value::~Value((Value *)&local_138);
  Json::Value::Value(&local_b8,nullValue);
  Json::Value::Value((Value *)&local_138,0);
  Json::Value::append(&local_b8,(Value *)&local_138);
  Json::Value::~Value((Value *)&local_138);
  Json::Value::Value((Value *)&local_138,0);
  Json::Value::append(&local_b8,(Value *)&local_138);
  Json::Value::~Value((Value *)&local_138);
  Json::Value::Value(&local_e0,nullValue);
  Json::Value::Value((Value *)&local_138,0);
  Json::Value::append(&local_e0,(Value *)&local_138);
  Json::Value::~Value((Value *)&local_138);
  Json::Value::Value((Value *)&local_138,10);
  Json::Value::append(&local_e0,(Value *)&local_138);
  Json::Value::~Value((Value *)&local_138);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_138.int_._0_4_ = pTVar1->predicateId_;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_128 = 0x588;
  local_120 = "checkIsLess(emptyArray, l1aArray)";
  local_118 = 0;
  uStack_110 = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&local_138;
  pTVar1->predicateId_ = local_138.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&local_138;
  ValueTest::checkIsLess(&this->super_ValueTest,&local_68,&local_90);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_138.int_._0_4_ = pTVar1->predicateId_;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_128 = 0x589;
  local_120 = "checkIsLess(emptyArray, l2aArray)";
  local_118 = 0;
  uStack_110 = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&local_138;
  pTVar1->predicateId_ = local_138.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&local_138;
  ValueTest::checkIsLess(&this->super_ValueTest,&local_68,&local_b8);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_138.int_._0_4_ = pTVar1->predicateId_;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_128 = 0x58a;
  local_120 = "checkIsLess(l1aArray, l2aArray)";
  local_118 = 0;
  uStack_110 = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&local_138;
  pTVar1->predicateId_ = local_138.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&local_138;
  ValueTest::checkIsLess(&this->super_ValueTest,&local_90,&local_b8);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_138.int_._0_4_ = pTVar1->predicateId_;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_128 = 0x58b;
  local_120 = "checkIsLess(l2aArray, l2bArray)";
  local_118 = 0;
  uStack_110 = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&local_138;
  pTVar1->predicateId_ = local_138.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&local_138;
  ValueTest::checkIsLess(&this->super_ValueTest,&local_b8,&local_e0);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_138.int_._0_4_ = pTVar1->predicateId_;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_128 = 0x58c;
  local_120 = "checkIsEqual(emptyArray, Json::Value(emptyArray))";
  local_118 = 0;
  uStack_110 = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&local_138;
  pTVar1->predicateId_ = local_138.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&local_138;
  Json::Value::Value(&local_108,&local_68);
  ValueTest::checkIsEqual(&this->super_ValueTest,&local_68,&local_108);
  Json::Value::~Value(&local_108);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_138.int_._0_4_ = pTVar1->predicateId_;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_128 = 0x58d;
  local_120 = "checkIsEqual(l1aArray, Json::Value(l1aArray))";
  local_118 = 0;
  uStack_110 = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&local_138;
  pTVar1->predicateId_ = local_138.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&local_138;
  Json::Value::Value(&local_108,&local_90);
  ValueTest::checkIsEqual(&this->super_ValueTest,&local_90,&local_108);
  Json::Value::~Value(&local_108);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_138.int_._0_4_ = pTVar1->predicateId_;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_128 = 0x58e;
  local_120 = "checkIsEqual(l2bArray, Json::Value(l2bArray))";
  local_118 = 0;
  uStack_110 = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&local_138;
  pTVar1->predicateId_ = local_138.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&local_138;
  Json::Value::Value(&local_108,&local_e0);
  ValueTest::checkIsEqual(&this->super_ValueTest,&local_e0,&local_108);
  Json::Value::~Value(&local_108);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  Json::Value::~Value(&local_e0);
  Json::Value::~Value(&local_b8);
  Json::Value::~Value(&local_40);
  Json::Value::~Value(&local_90);
  Json::Value::~Value(&local_68);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, compareArray) {
  // array compare size then content
  Json::Value emptyArray(Json::arrayValue);
  Json::Value l1aArray;
  l1aArray.append(0);
  Json::Value l1bArray;
  l1bArray.append(10);
  Json::Value l2aArray;
  l2aArray.append(0);
  l2aArray.append(0);
  Json::Value l2bArray;
  l2bArray.append(0);
  l2bArray.append(10);
  JSONTEST_ASSERT_PRED(checkIsLess(emptyArray, l1aArray));
  JSONTEST_ASSERT_PRED(checkIsLess(emptyArray, l2aArray));
  JSONTEST_ASSERT_PRED(checkIsLess(l1aArray, l2aArray));
  JSONTEST_ASSERT_PRED(checkIsLess(l2aArray, l2bArray));
  JSONTEST_ASSERT_PRED(checkIsEqual(emptyArray, Json::Value(emptyArray)));
  JSONTEST_ASSERT_PRED(checkIsEqual(l1aArray, Json::Value(l1aArray)));
  JSONTEST_ASSERT_PRED(checkIsEqual(l2bArray, Json::Value(l2bArray)));
}